

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateEnumOptions
          (DescriptorBuilder *this,EnumDescriptor *enm,EnumDescriptorProto *proto)

{
  long lVar1;
  int iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  Type *descriptor;
  int i;
  int index;
  long lVar5;
  long lVar6;
  key_type local_f4;
  RepeatedPtrFieldBase *local_f0;
  DescriptorBuilder *local_e8;
  string error;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  used_values;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_e8 = this;
  for (index = 0; iVar2 = *(int *)(enm + 4), index < iVar2; index = index + 1) {
    internal::RepeatedPtrFieldBase::
    Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
              (&(proto->value_).super_RepeatedPtrFieldBase,index);
  }
  if (((*(byte *)(*(long *)(enm + 0x20) + 0x28) & 1) == 0) ||
     (*(char *)(*(long *)(enm + 0x20) + 0x48) == '\0')) {
    used_values._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &used_values._M_t._M_impl.super__Rb_tree_header._M_header;
    used_values._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    used_values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    used_values._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar6 = 4;
    lVar5 = 0;
    local_f0 = &(proto->value_).super_RepeatedPtrFieldBase;
    used_values._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         used_values._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (; lVar5 < iVar2; lVar5 = lVar5 + 1) {
      lVar1 = *(long *)(enm + 0x28);
      error._M_dataplus._M_p._0_4_ = *(undefined4 *)(lVar1 + lVar6);
      iVar3 = std::
              _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&used_values._M_t,(key_type *)&error);
      if ((_Rb_tree_header *)iVar3._M_node == &used_values._M_t._M_impl.super__Rb_tree_header) {
        error._M_dataplus._M_p._0_4_ = *(undefined4 *)(lVar1 + lVar6);
        pmVar4 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&used_values,(key_type *)&error);
        std::__cxx11::string::_M_assign((string *)pmVar4);
      }
      else {
        std::operator+(&local_70,"\"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)(lVar1 + 4 + lVar6) + 0x20));
        std::operator+(&local_90,&local_70,"\" uses the same enum value as \"");
        local_f4 = *(key_type *)(lVar1 + lVar6);
        pmVar4 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&used_values,&local_f4);
        std::operator+(&local_50,&local_90,pmVar4);
        std::operator+(&error,&local_50,
                       "\". If this is intended, set \'option allow_alias = true;\' to the enum definition."
                      );
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
        if (*(char *)(*(long *)(enm + 0x20) + 0x48) == '\0') {
          lVar1 = *(long *)(enm + 8);
          descriptor = internal::RepeatedPtrFieldBase::
                       Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::TypeHandler>
                                 (local_f0,(int)lVar5);
          AddError(local_e8,(string *)(lVar1 + 0x20),&descriptor->super_Message,NUMBER,&error);
        }
        std::__cxx11::string::~string((string *)&error);
      }
      iVar2 = *(int *)(enm + 4);
      lVar6 = lVar6 + 0x20;
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&used_values._M_t);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateEnumOptions(EnumDescriptor* enm,
                                            const EnumDescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(enm, value, EnumValue);
  if (!enm->options().has_allow_alias() || !enm->options().allow_alias()) {
    std::map<int, std::string> used_values;
    for (int i = 0; i < enm->value_count(); ++i) {
      const EnumValueDescriptor* enum_value = enm->value(i);
      if (used_values.find(enum_value->number()) != used_values.end()) {
        std::string error =
            "\"" + enum_value->full_name() +
            "\" uses the same enum value as \"" +
            used_values[enum_value->number()] +
            "\". If this is intended, set "
            "'option allow_alias = true;' to the enum definition.";
        if (!enm->options().allow_alias()) {
          // Generate error if duplicated enum values are explicitly disallowed.
          AddError(enm->full_name(), proto.value(i),
                   DescriptorPool::ErrorCollector::NUMBER, error);
        }
      } else {
        used_values[enum_value->number()] = enum_value->full_name();
      }
    }
  }
}